

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupDrawData(ImVector<ImDrawList_*> *draw_lists,ImDrawData *draw_data)

{
  float fVar1;
  ImVec2 local_38;
  int local_2c;
  ImVec2 IStack_28;
  int n;
  ImGuiIO *local_20;
  ImGuiIO *io;
  ImDrawData *draw_data_local;
  ImVector<ImDrawList_*> *draw_lists_local;
  
  io = (ImGuiIO *)draw_data;
  draw_data_local = (ImDrawData *)draw_lists;
  local_20 = ImGui::GetIO();
  *(undefined1 *)&io->ConfigFlags = 1;
  if (*(int *)draw_data_local < 1) {
    local_38.x = 0.0;
    local_38.y = 0.0;
  }
  else {
    local_38 = (ImVec2)draw_data_local->CmdLists;
  }
  io->DisplaySize = local_38;
  io->DeltaTime = *(float *)draw_data_local;
  io->IniSavingRate = 0.0;
  *(undefined4 *)&io->IniFilename = 0;
  ImVec2::ImVec2(&stack0xffffffffffffffd8,0.0,0.0);
  *(ImVec2 *)((long)&io->IniFilename + 4) = IStack_28;
  *(ImVec2 *)((long)&io->LogFilename + 4) = local_20->DisplaySize;
  fVar1 = (local_20->DisplayFramebufferScale).y;
  io->MouseDoubleClickMaxDist = (local_20->DisplayFramebufferScale).x;
  io->MouseDragThreshold = fVar1;
  for (local_2c = 0; local_2c < *(int *)draw_data_local; local_2c = local_2c + 1) {
    *(int *)&io->IniFilename =
         (draw_data_local->CmdLists[local_2c]->VtxBuffer).Size + *(int *)&io->IniFilename;
    io->IniSavingRate =
         (float)((draw_data_local->CmdLists[local_2c]->IdxBuffer).Size + (int)io->IniSavingRate);
  }
  return;
}

Assistant:

static void SetupDrawData(ImVector<ImDrawList*>* draw_lists, ImDrawData* draw_data)
{
    ImGuiIO& io = ImGui::GetIO();
    draw_data->Valid = true;
    draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    draw_data->CmdListsCount = draw_lists->Size;
    draw_data->TotalVtxCount = draw_data->TotalIdxCount = 0;
    draw_data->DisplayPos = ImVec2(0.0f, 0.0f);
    draw_data->DisplaySize = io.DisplaySize;
    draw_data->FramebufferScale = io.DisplayFramebufferScale;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}